

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

void __thiscall Minisat::BoolOption::giveRndValue(BoolOption *this,string *optionText)

{
  int iVar1;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  iVar1 = rand();
  if (iVar1 % 5 < 2) {
    std::__cxx11::string::string((string *)&local_50,(this->super_Option).name,&local_51);
    std::operator+(&local_30,"-no-",&local_50);
  }
  else {
    std::__cxx11::string::string((string *)&local_50,(this->super_Option).name,&local_51);
    std::operator+(&local_30,"-",&local_50);
  }
  std::__cxx11::string::operator=((string *)optionText,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void giveRndValue(std::string &optionText)
    {
        int r = rand();
        if (r % 5 > 1) { // more likely to be enabled
            optionText = "-" + std::string(name);
        } else {
            optionText = "-no-" + std::string(name);
        }
    }